

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O3

Promise<void> __thiscall
capnp::
Request<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>
::sendIgnoringResult
          (Request<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>
           *this)

{
  long *plVar1;
  OwnPromiseNode node;
  long lVar2;
  undefined8 uVar3;
  long in_RSI;
  RemotePromise<capnp::AnyPointer> typelessPromise;
  void *continuationTracePtr;
  anon_class_1_0_00000001_for_func local_49;
  OwnPromiseNode local_48;
  undefined8 *local_40;
  long *local_38;
  long local_30;
  undefined8 uStack_28;
  undefined8 *local_20;
  code *local_18;
  
  (**(code **)**(undefined8 **)(in_RSI + 0x30))(&local_48);
  plVar1 = *(long **)(in_RSI + 0x30);
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)(in_RSI + 0x30) = 0;
    (**(code **)**(undefined8 **)(in_RSI + 0x28))
              (*(undefined8 **)(in_RSI + 0x28),(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  local_18 = kj::_::
             SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h:260:68)>
             ::anon_class_1_0_00000001_for_func::operator();
  kj::_::PromiseDisposer::
  appendPromise<kj::_::SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,kj::Promise<capnp::Response<capnp::AnyPointer>>::ignoreResult()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_>,kj::_::PromiseDisposer,kj::Promise<capnp::Response<capnp::AnyPointer>>::ignoreResult()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,void*&>
            ((PromiseDisposer *)this,&local_48,&local_49,&local_18);
  uVar3 = uStack_28;
  lVar2 = local_30;
  if (local_30 != 0) {
    local_30 = 0;
    uStack_28 = 0;
    (**(code **)*local_20)(local_20,lVar2,8,uVar3,uVar3,0);
  }
  plVar1 = local_38;
  if (local_38 != (long *)0x0) {
    local_38 = (long *)0x0;
    (**(code **)*local_40)(local_40,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  node.ptr = local_48.ptr;
  if (&(local_48.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_48.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> Request<Params, Results>::sendIgnoringResult() {
  auto typelessPromise = hook->send();
  hook = nullptr;  // prevent reuse
  return kj::mv(typelessPromise).ignoreResult();
}